

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForParameterAndIgnored_Test::
~TEST_MockExpectedCall_toStringForParameterAndIgnored_Test
          (TEST_MockExpectedCall_toStringForParameterAndIgnored_Test *this)

{
  TEST_MockExpectedCall_toStringForParameterAndIgnored_Test *this_local;
  
  ~TEST_MockExpectedCall_toStringForParameterAndIgnored_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForParameterAndIgnored)
{
    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.ignoreOtherParameters();
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, other parameters are ignored (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}